

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbcLoad(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *format;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    pAVar2 = pAbc->pNtkBest;
    if (pAVar2 != (Abc_Ntk_t *)0x0) {
      if (pAbc->pNtkCur != (Abc_Ntk_t *)0x0) {
        Abc_NtkDelete(pAbc->pNtkCur);
        pAVar2 = pAbc->pNtkBest;
      }
      pAVar2 = Abc_NtkDup(pAVar2);
      pAbc->pNtkCur = pAVar2;
      return 0;
    }
    format = "Abc_CommandAbcLoad(): There is no best design saved.\n";
    iVar1 = -1;
  }
  else {
    Abc_Print(-2,"usage: load [-h]\n");
    Abc_Print(-2,"\t        loads mapped network previously saved by \"save\"\n");
    format = "\t-h    : print the command usage\n";
    iVar1 = -2;
  }
  Abc_Print(iVar1,format);
  return 1;
}

Assistant:

int Abc_CommandAbcLoad( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    // restore from best
    if ( pAbc->pNtkBest == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbcLoad(): There is no best design saved.\n" );
        return 1;
    }
    if ( pAbc->pNtkCur ) Abc_NtkDelete( pAbc->pNtkCur );
    pAbc->pNtkCur = Abc_NtkDup(pAbc->pNtkBest);
    return 0;

usage:
    Abc_Print( -2, "usage: load [-h]\n" );
    Abc_Print( -2, "\t        loads mapped network previously saved by \"save\"\n" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}